

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O0

connection_ptr __thiscall
websocketpp::endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
::get_con_from_hdl(endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                   *this,connection_hdl *hdl,error_code *ec)

{
  bool bVar1;
  undefined8 *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  error_code eVar3;
  connection_ptr cVar4;
  connection_ptr *con;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 uStack_44;
  
  std::weak_ptr<void>::lock
            ((weak_ptr<void> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::static_pointer_cast<websocketpp::connection<websocketpp::config::asio>,void>
            ((shared_ptr<void> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x2ca210);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
  _Var2._M_pi = extraout_RDX;
  if (!bVar1) {
    eVar3 = error::make_error_code(0);
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar3._M_cat;
    *in_RCX = CONCAT44(uStack_44,eVar3._M_value);
    in_RCX[1] = _Var2._M_pi;
  }
  cVar4.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  cVar4.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (connection_ptr)
         cVar4.
         super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

connection_ptr get_con_from_hdl(connection_hdl hdl, lib::error_code & ec) {
        connection_ptr con = lib::static_pointer_cast<connection_type>(
            hdl.lock());
        if (!con) {
            ec = error::make_error_code(error::bad_connection);
        }
        return con;
    }